

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_rc_Buf.h
# Opt level: O2

void __thiscall
axl::rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move
          (BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> *this,
          BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> *src)

{
  BufHdr *pBVar1;
  
  if (this->m_hdr != (BufHdr *)0x0) {
    RefCount::release(&this->m_hdr->super_RefCount);
  }
  pBVar1 = src->m_hdr;
  this->m_p = src->m_p;
  this->m_hdr = pBVar1;
  this->m_size = src->m_size;
  src->m_p = (ErrorHdr *)0x0;
  src->m_hdr = (BufHdr *)0x0;
  src->m_size = 0;
  return;
}

Assistant:

void
	move(BufRef&& src) {
		if (m_hdr)
			m_hdr->release();

		m_p = src.m_p;
		m_hdr = src.m_hdr;
		m_size = src.m_size;
		src.initialize();
	}